

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O1

void __thiscall PatternGridHeader::contextMenuEvent(PatternGridHeader *this,QContextMenuEvent *evt)

{
  int iVar1;
  QPoint *this_00;
  void **ppvVar2;
  undefined4 *puVar3;
  QString local_80;
  QPoint *local_68;
  QContextMenuEvent *local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  code *local_40;
  ImplFn local_38;
  
  this_00 = (QPoint *)operator_new(0x28);
  QMenu::QMenu((QMenu *)this_00,&this->super_QWidget);
  local_60 = evt;
  QWidget::setAttribute((WidgetAttribute)this_00,true);
  iVar1 = this->mTrackHover;
  if (iVar1 != -1) {
    toggleChannelString(&local_80,iVar1 + 1);
    ppvVar2 = (void **)QMenu::addAction((QString *)this_00);
    local_68 = (QPoint *)CONCAT44(local_68._4_4_,iVar1 + 1);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
      }
    }
    local_80.d.d = (Data *)QAction::triggered;
    local_80.d.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/grid/PatternGridHeader.cpp:172:13),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(PatternGridHeader **)(puVar3 + 4) = this;
    puVar3[6] = iVar1;
    QObject::connectImpl
              (local_48,ppvVar2,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    soloChannelString(&local_80,(int)local_68);
    ppvVar2 = (void **)QMenu::addAction((QString *)this_00);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
      }
    }
    local_80.d.d = (Data *)QAction::triggered;
    local_80.d.ptr = (char16_t *)0x0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/widgets/grid/PatternGridHeader.cpp:177:13),_0,_QtPrivate::List<>,_void>
         ::impl;
    *(PatternGridHeader **)(puVar3 + 4) = this;
    puVar3[6] = iVar1;
    QObject::connectImpl
              (local_50,ppvVar2,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    QMenu::addSeparator();
  }
  QMetaObject::tr((char *)&local_80,(char *)&staticMetaObject,0x1b7d42);
  ppvVar2 = (void **)QMenu::addAction((QString *)this_00);
  local_68 = this_00;
  if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
    }
  }
  local_80.d.d = (Data *)QAction::triggered;
  local_80.d.ptr = (char16_t *)0x0;
  local_40 = unmuteAll;
  local_38 = (ImplFn)0x0;
  puVar3 = (undefined4 *)operator_new(0x20);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::QSlotObject<void_(PatternGridHeader::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar3 + 4) = unmuteAll;
  *(undefined8 *)(puVar3 + 6) = 0;
  QObject::connectImpl
            (local_58,ppvVar2,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)&local_40,
             (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  QMenu::popup(local_68,(QAction *)(local_60 + 0x30));
  return;
}

Assistant:

void PatternGridHeader::contextMenuEvent(QContextMenuEvent *evt) {
    auto menu = new QMenu(this);
    menu->setAttribute(Qt::WA_DeleteOnClose);

    QAction *act;

    if (mTrackHover != HOVER_NONE) {
        // add actions for the current track
        auto channelNum = mTrackHover + 1;
        auto trackHover = mTrackHover;
        act = menu->addAction(toggleChannelString(channelNum));
        connect(act, &QAction::triggered, this,
            [this, trackHover]() {
                toggleTrack(trackHover);
            });
        act = menu->addAction(soloChannelString(channelNum));
        connect(act, &QAction::triggered, this,
            [this, trackHover]() {
                soloTrack(trackHover);
            });
        menu->addSeparator();
    }

    act = menu->addAction(tr("Unmute all channels"));
    connect(act, &QAction::triggered, this, &PatternGridHeader::unmuteAll);

    menu->popup(evt->globalPos());
}